

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall rsg::TexLookup::~TexLookup(TexLookup *this)

{
  ~TexLookup(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

TexLookup::~TexLookup (void)
{
	delete m_coordExpr;
	delete m_lodBiasExpr;
}